

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.cpp
# Opt level: O1

bool chatter::platform::SocketSetOption(Socket socket,SocketOption option,int value)

{
  int in_EAX;
  long *__optval;
  int __optname;
  socklen_t __optlen;
  timeval timeVal;
  undefined1 local_14 [4];
  long local_10;
  long local_8;
  
  local_14 = (undefined1  [4])value;
  switch(option) {
  case NONBLOCK:
    in_EAX = ioctl(socket,0x5421,local_14);
    goto switchD_0010d0b4_default;
  case BROADCAST:
    __optname = 6;
    break;
  case REUSEADDR:
    __optname = 2;
    break;
  case RCVBUF:
    __optname = 8;
    break;
  case SNDBUF:
    __optname = 7;
    break;
  case RCVTIMEO:
    __optname = 0x14;
    goto LAB_0010d19e;
  case SNDTIMEO:
    __optname = 0x15;
LAB_0010d19e:
    local_8 = (long)((value % 1000) * 1000);
    local_10 = (long)(value / 1000);
    __optval = &local_10;
    __optlen = 0x10;
    goto LAB_0010d1a4;
  default:
    goto switchD_0010d0b4_default;
  }
  __optval = (long *)local_14;
  __optlen = 4;
LAB_0010d1a4:
  in_EAX = setsockopt(socket,1,__optname,__optval,__optlen);
switchD_0010d0b4_default:
  return in_EAX == 0;
}

Assistant:

bool SocketSetOption(Socket socket, SocketOption option, int value)
{
    int result;
    struct timeval timeVal;

    switch (option) {
        case SocketOption::NONBLOCK:
            result = ioctl(socket, FIONBIO, &value);
            break;

        case SocketOption::BROADCAST:
            result = setsockopt(socket, SOL_SOCKET, SO_BROADCAST, (char*)&value, sizeof(int));
            break;

        case SocketOption::REUSEADDR:
            result = setsockopt(socket, SOL_SOCKET, SO_REUSEADDR, (char*)&value, sizeof(int));
            break;

        case SocketOption::RCVBUF:
            result = setsockopt(socket, SOL_SOCKET, SO_RCVBUF, (char*)&value, sizeof(int));
            break;

        case SocketOption::SNDBUF:
            result = setsockopt(socket, SOL_SOCKET, SO_SNDBUF, (char*)&value, sizeof(int));
            break;

        case SocketOption::RCVTIMEO:
            timeVal.tv_sec = value / 1000;
            timeVal.tv_usec = (value % 1000) * 1000;
            result = setsockopt(socket, SOL_SOCKET, SO_RCVTIMEO, (char*)&timeVal, sizeof(struct timeval));
            break;

        case SocketOption::SNDTIMEO:
            timeVal.tv_sec = value / 1000;
            timeVal.tv_usec = (value % 1000) * 1000;
            result = setsockopt(socket, SOL_SOCKET, SO_SNDTIMEO, (char*)&timeVal, sizeof(struct timeval));
            break;

#if 0
        case SocketOption::NODELAY:
            result = setsockopt(socket, IPPROTO_TCP, TCP_NODELAY, (char*)&value, sizeof(int));
            break;
#endif
    }
    return result == 0 ? true : false;
}